

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O2

void __thiscall
trun::ResultsReportJSON::PrintPasses
          (ResultsReportJSON *this,
          vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
          *results)

{
  __shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ResultsReportJSON *pRVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  __shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  initializer_list<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_ee;
  less<trun::kTestResult> local_ed;
  anon_enum_8 local_ec [4];
  ResultsReportJSON *local_e8;
  __shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> local_e0;
  shared_ptr<trun::TestResult> r;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  if ((this->bHadFailures != false) || (this->bHadSummary == true)) {
    ResultsReportPinterBase::WriteNoIndent(&this->super_ResultsReportPinterBase,",\n");
  }
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"\"Passes\":[");
  local_e8 = this;
  ResultsReportPinterBase::PushIndent(&this->super_ResultsReportPinterBase);
  if (PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
      ::resultToName_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
                                 ::resultToName_abi_cxx11_);
    if (iVar3 != 0) {
      local_ec[3] = 0;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[5],_true>
                ((pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&r,local_ec + 3,(char (*) [5])"Pass");
      local_ec[2] = 3;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[8],_true>
                (&local_a8,local_ec + 2,(char (*) [8])"AllFail");
      local_ec[1] = 2;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[11],_true>
                (&local_80,local_ec + 1,(char (*) [11])"ModuleFail");
      local_ec[0] = kTestResult_TestFail;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[9],_true>
                (&local_58,local_ec,(char (*) [9])"TestFail");
      __l._M_len = 4;
      __l._M_array = (iterator)&r;
      std::
      map<trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<trun::kTestResult>,_std::allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
             ::resultToName_abi_cxx11_,__l,&local_ed,&local_ee);
      lVar5 = 0x80;
      do {
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + lVar5));
        lVar5 = lVar5 + -0x28;
      } while (lVar5 != -0x20);
      __cxa_atexit(std::
                   map<trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<trun::kTestResult>,_std::allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
                           ::resultToName_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
                           ::resultToName_abi_cxx11_);
    }
  }
  p_Var1 = &((results->
             super__Vector_base<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>;
  bVar4 = false;
  for (p_Var6 = &((results->
                  super__Vector_base<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>; pRVar2 = local_e8
      , p_Var6 != p_Var1; p_Var6 = p_Var6 + 1) {
    std::__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>,p_Var6);
    pRVar2 = local_e8;
    if ((r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->testResult ==
        kTestResult_Pass) {
      if (bVar4) {
        ResultsReportPinterBase::WriteNoIndent(&local_e8->super_ResultsReportPinterBase,",\n");
      }
      std::__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_e0,&r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>);
      PrintTestResult(pRVar2,(Ref *)&local_e0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
      bVar4 = true;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  ResultsReportPinterBase::PopIndent(&local_e8->super_ResultsReportPinterBase);
  ResultsReportPinterBase::WriteLine(&pRVar2->super_ResultsReportPinterBase,"");
  ResultsReportPinterBase::Write(&pRVar2->super_ResultsReportPinterBase,"]");
  pRVar2->bHadSuccess = true;
  return;
}

Assistant:

void ResultsReportJSON::PrintPasses(const std::vector<TestResult::Ref> &results) {
    if (bHadFailures || bHadSummary) {
        WriteNoIndent(",\n");
        //fprintf(fout,",\n");
    }
    WriteLine(R"("Passes":[)");
    PushIndent();
    static std::map<kTestResult, std::string> resultToName={
            {kTestResult_Pass, "Pass"},
            {kTestResult_AllFail, "AllFail"},
            {kTestResult_ModuleFail,"ModuleFail"},
            {kTestResult_TestFail, "TestFail"},
    };
    bool bNeedComma = false;

    for (auto r : results) {
        if (r->Result() != kTestResult_Pass) {
            continue;
        }
        if (bNeedComma) {
            WriteNoIndent(",\n");
        }
        PrintTestResult(r);
        bNeedComma = true;
    }
    PopIndent();
    WriteLine("");
    Write("]");

    bHadSuccess = true;
}